

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O2

void jp2_cmap_dumpdata(jp2_box_t *box,FILE *out)

{
  jp2_cdefchan_t *pjVar1;
  uint uVar2;
  ulong uVar3;
  
  fprintf((FILE *)out,"numchans = %d\n",(ulong)*(uint *)&box->data);
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < (box->data).ftyp.majver; uVar2 = uVar2 + 1) {
    pjVar1 = (box->data).cdef.ents;
    fprintf((FILE *)out,"cmptno=%d; map=%d; pcol=%d\n",(ulong)(uint)(&pjVar1->channo)[uVar3 * 2],
            (ulong)(byte)(&pjVar1->type)[uVar3 * 2],
            (ulong)*(byte *)((long)&pjVar1->type + uVar3 * 0x10 + 1));
  }
  return;
}

Assistant:

static void jp2_cmap_dumpdata(jp2_box_t *box, FILE *out)
{
	jp2_cmap_t *cmap = &box->data.cmap;
	unsigned int i;
	jp2_cmapent_t *ent;
	fprintf(out, "numchans = %d\n", (int) cmap->numchans);
	for (i = 0; i < cmap->numchans; ++i) {
		ent = &cmap->ents[i];
		fprintf(out, "cmptno=%d; map=%d; pcol=%d\n",
		  (int) ent->cmptno, (int) ent->map, (int) ent->pcol);
	}
}